

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDrawTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::anon_unknown_0::MethodGroup::init(MethodGroup *this,EVP_PKEY_CTX *ctx)

{
  DrawMethod DVar1;
  DrawMethod DVar2;
  uint uVar3;
  Context *pCVar4;
  TestNode *pTVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  Primitive primitive;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  long lVar7;
  string desc;
  string name;
  string local_70;
  string local_50;
  
  DVar1 = this->m_method;
  if (DVar1 < DRAWMETHOD_DRAWARRAYS_INDIRECT) {
    pTVar5 = (TestNode *)operator_new(0x80);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,pCVar4->m_testCtx,"first","First tests");
    pTVar5[1]._vptr_TestNode = (_func_int **)pCVar4;
    pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_0216db78;
    *(DrawMethod *)&pTVar5[1].m_testCtx = DVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar5);
    in_RDX = extraout_RDX;
  }
  DVar2 = this->m_method;
  if (DVar2 != DRAWMETHOD_DRAWELEMENTS_RANGED &&
      0xfffffffc < DVar1 - DRAWMETHOD_DRAWELEMENTS_INDIRECT) {
    pTVar5 = (TestNode *)operator_new(0x80);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,pCVar4->m_testCtx,"indices","Index tests");
    pTVar5[1]._vptr_TestNode = (_func_int **)pCVar4;
    pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_0216dbc8;
    *(DrawMethod *)&pTVar5[1].m_testCtx = DVar2;
    tcu::TestNode::addChild((TestNode *)this,pTVar5);
    in_RDX = extraout_RDX_00;
  }
  lVar7 = 0;
  do {
    uVar3 = *(uint *)((long)RandomGroup::init::primitives + lVar7);
    deqp::gls::DrawTestSpec::primitiveToString_abi_cxx11_
              (&local_50,(DrawTestSpec *)(ulong)uVar3,(Primitive)in_RDX);
    deqp::gls::DrawTestSpec::primitiveToString_abi_cxx11_
              (&local_70,(DrawTestSpec *)(ulong)uVar3,primitive);
    pTVar5 = (TestNode *)operator_new(0x88);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    DVar1 = this->m_method;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,pCVar4->m_testCtx,local_50._M_dataplus._M_p,
               local_70._M_dataplus._M_p);
    pTVar5[1]._vptr_TestNode = (_func_int **)pCVar4;
    pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_0216dc18;
    *(DrawMethod *)&pTVar5[1].m_testCtx = DVar1;
    *(uint *)((long)&pTVar5[1].m_testCtx + 4) = uVar3;
    pTVar5[1].m_name._M_dataplus._M_p = &DAT_100000001;
    tcu::TestNode::addChild((TestNode *)this,pTVar5);
    in_RDX = extraout_RDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      in_RDX = extraout_RDX_02;
    }
    paVar6 = &local_50.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar6) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      paVar6 = extraout_RAX;
      in_RDX = extraout_RDX_03;
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x1c);
  return (int)paVar6;
}

Assistant:

void MethodGroup::init (void)
{
	const bool indexed		= (m_method == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS) || (m_method == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INSTANCED) || (m_method == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED);
	const bool hasFirst		= (m_method == gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS) || (m_method == gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS_INSTANCED);

	const gls::DrawTestSpec::Primitive primitive[] =
	{
		gls::DrawTestSpec::PRIMITIVE_POINTS,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLES,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLE_FAN,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP,
		gls::DrawTestSpec::PRIMITIVE_LINES,
		gls::DrawTestSpec::PRIMITIVE_LINE_STRIP,
		gls::DrawTestSpec::PRIMITIVE_LINE_LOOP
	};

	if (hasFirst)
	{
		// First-tests
		this->addChild(new FirstGroup(m_context, "first", "First tests", m_method));
	}

	if (indexed)
	{
		// Index-tests
		if (m_method != gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED)
			this->addChild(new IndexGroup(m_context, "indices", "Index tests", m_method));
	}

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(primitive); ++ndx)
	{
		const std::string name = gls::DrawTestSpec::primitiveToString(primitive[ndx]);
		const std::string desc = gls::DrawTestSpec::primitiveToString(primitive[ndx]);

		this->addChild(new AttributeGroup(m_context, name.c_str(), desc.c_str(), m_method, primitive[ndx], gls::DrawTestSpec::INDEXTYPE_SHORT, gls::DrawTestSpec::STORAGE_BUFFER));
	}
}